

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::value_t,_toml::error_info> *
toml::detail::guess_value_type<toml::type_config>
          (result<toml::value_t,_toml::error_info> *__return_storage_ptr__,location *loc,
          context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  string *this;
  location inner;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  either local_7f0;
  region local_7d0;
  location local_768;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  location local_520;
  location local_4d8;
  location local_490;
  location local_448;
  location local_400;
  location local_3b8;
  location local_370;
  location local_328;
  error_info local_2e0;
  error_info local_288;
  error_info local_230;
  error_info local_1d8;
  error_info local_180;
  error_info local_128;
  error_info local_d0;
  error_info local_78;
  
  location::location(&local_768,loc);
  cVar2 = location::current(loc);
  if ((cVar2 == '\"') || (cVar2 == '\'')) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = string;
    goto LAB_0032b919;
  }
  if (cVar2 == 'F') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,
               "toml::parse_value: `false` must be in lowercase. A string must be surrounded by quotes."
               ,&local_7f1);
    syntax::boolean(&local_7f0,&ctx->toml_spec_);
    location::location(&local_370,&local_768);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"",&local_7f2);
    make_syntax_error<toml::detail::either>
              ((error_info *)&local_7d0,&local_580,&local_7f0,&local_370,&local_5a0);
    err<toml::error_info>((failure<toml::error_info> *)&local_d0,(error_info *)&local_7d0);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_d0);
    error_info::~error_info(&local_d0);
    error_info::~error_info((error_info *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_5a0);
    location::~location(&local_370);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_7f0.others_);
    this = &local_580;
  }
  else if (cVar2 == 'I') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,
               "toml::parse_value: `inf` must be in lowercase. A string must be surrounded by quotes."
               ,&local_7f1);
    syntax::floating(&local_7f0,&ctx->toml_spec_);
    location::location(&local_400,&local_768);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"",&local_7f2);
    make_syntax_error<toml::detail::either>
              ((error_info *)&local_7d0,&local_600,&local_7f0,&local_400,&local_620);
    err<toml::error_info>((failure<toml::error_info> *)&local_180,(error_info *)&local_7d0);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_180);
    error_info::~error_info(&local_180);
    error_info::~error_info((error_info *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_620);
    location::~location(&local_400);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_7f0.others_);
    this = &local_600;
  }
  else if (cVar2 == 'N') {
    if ((ctx->toml_spec_).ext_null_value == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c0,
                 "toml::parse_value: Both `nan` and `null` must be in lowercase. A string must be surrounded by quotes."
                 ,&local_7f1);
      syntax::floating(&local_7f0,&ctx->toml_spec_);
      location::location(&local_4d8,&local_768);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"",&local_7f2);
      make_syntax_error<toml::detail::either>
                ((error_info *)&local_7d0,&local_6c0,&local_7f0,&local_4d8,&local_6e0);
      err<toml::error_info>((failure<toml::error_info> *)&local_288,(error_info *)&local_7d0);
      result<toml::value_t,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_288);
      error_info::~error_info(&local_288);
      error_info::~error_info((error_info *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_6e0);
      location::~location(&local_4d8);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_7f0.others_);
      this = &local_6c0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,
                 "toml::parse_value: `nan` must be in lowercase. A string must be surrounded by quotes."
                 ,&local_7f1);
      syntax::floating(&local_7f0,&ctx->toml_spec_);
      location::location(&local_520,&local_768);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"",&local_7f2);
      make_syntax_error<toml::detail::either>
                ((error_info *)&local_7d0,&local_700,&local_7f0,&local_520,&local_720);
      err<toml::error_info>((failure<toml::error_info> *)&local_2e0,(error_info *)&local_7d0);
      result<toml::value_t,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_2e0);
      error_info::~error_info(&local_2e0);
      error_info::~error_info((error_info *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_720);
      location::~location(&local_520);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(&local_7f0.others_);
      this = &local_700;
    }
  }
  else {
    if (cVar2 != 'T') {
      if (cVar2 == '[') {
        __return_storage_ptr__->is_ok_ = true;
        (__return_storage_ptr__->field_1).succ_.value = array;
        goto LAB_0032b919;
      }
      if (cVar2 != 'f') {
        if (cVar2 == 'i') {
          local_7f0.super_scanner_base._vptr_scanner_base =
               (_func_int **)&PTR__scanner_base_004daa58;
          local_7f0.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3acd39;
          local_7f0.others_.
          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
          literal::scan(&local_7d0,(literal *)&local_7f0,&local_768);
          region::~region(&local_7d0);
          if (local_7d0.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) goto LAB_0032b74f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,
                     "toml::parse_value: `inf` must be in lowercase. A string must be surrounded by quotes."
                     ,&local_7f1);
          syntax::floating(&local_7f0,&ctx->toml_spec_);
          location::location(&local_3b8,&local_768);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"",&local_7f2);
          make_syntax_error<toml::detail::either>
                    ((error_info *)&local_7d0,&local_5c0,&local_7f0,&local_3b8,&local_5e0);
          err<toml::error_info>((failure<toml::error_info> *)&local_128,(error_info *)&local_7d0);
          result<toml::value_t,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_128);
          error_info::~error_info(&local_128);
          error_info::~error_info((error_info *)&local_7d0);
          std::__cxx11::string::~string((string *)&local_5e0);
          location::~location(&local_3b8);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_7f0.others_);
          this = &local_5c0;
          goto LAB_0032b914;
        }
        if (cVar2 == 'n') {
          if ((ctx->toml_spec_).ext_null_value == true) {
            local_7f0.super_scanner_base._vptr_scanner_base =
                 (_func_int **)&PTR__scanner_base_004daa58;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3a9f05;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
            literal::scan(&local_7d0,(literal *)&local_7f0,&local_768);
            peVar1 = local_7d0.source_.
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            region::~region(&local_7d0);
            if (peVar1 != (element_type *)0x0) {
LAB_0032b74f:
              __return_storage_ptr__->is_ok_ = true;
              (__return_storage_ptr__->field_1).succ_.value = floating;
              goto LAB_0032b919;
            }
            local_7f0.super_scanner_base._vptr_scanner_base =
                 (_func_int **)&PTR__scanner_base_004daa58;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3a501d;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
            literal::scan(&local_7d0,(literal *)&local_7f0,&local_768);
            region::~region(&local_7d0);
            if (local_7d0.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) {
              __return_storage_ptr__->is_ok_ = true;
              (__return_storage_ptr__->field_1).succ_.value = empty;
              goto LAB_0032b919;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_640,
                       "toml::parse_value: Both `nan` and `null` must be in lowercase. A string must be surrounded by quotes."
                       ,&local_7f1);
            syntax::floating(&local_7f0,&ctx->toml_spec_);
            location::location(&local_448,&local_768);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"",&local_7f2);
            make_syntax_error<toml::detail::either>
                      ((error_info *)&local_7d0,&local_640,&local_7f0,&local_448,&local_660);
            err<toml::error_info>((failure<toml::error_info> *)&local_1d8,(error_info *)&local_7d0);
            result<toml::value_t,_toml::error_info>::result
                      (__return_storage_ptr__,(failure_type *)&local_1d8);
            error_info::~error_info(&local_1d8);
            error_info::~error_info((error_info *)&local_7d0);
            std::__cxx11::string::~string((string *)&local_660);
            location::~location(&local_448);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector(&local_7f0.others_);
            this = &local_640;
          }
          else {
            local_7f0.super_scanner_base._vptr_scanner_base =
                 (_func_int **)&PTR__scanner_base_004daa58;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3a9f05;
            local_7f0.others_.
            super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
            literal::scan(&local_7d0,(literal *)&local_7f0,&local_768);
            region::~region(&local_7d0);
            if (local_7d0.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr != (element_type *)0x0) goto LAB_0032b74f;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_680,
                       "toml::parse_value: `nan` must be in lowercase. A string must be surrounded by quotes."
                       ,&local_7f1);
            syntax::floating(&local_7f0,&ctx->toml_spec_);
            location::location(&local_490,&local_768);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"",&local_7f2);
            make_syntax_error<toml::detail::either>
                      ((error_info *)&local_7d0,&local_680,&local_7f0,&local_490,&local_6a0);
            err<toml::error_info>((failure<toml::error_info> *)&local_230,(error_info *)&local_7d0);
            result<toml::value_t,_toml::error_info>::result
                      (__return_storage_ptr__,(failure_type *)&local_230);
            error_info::~error_info(&local_230);
            error_info::~error_info((error_info *)&local_7d0);
            std::__cxx11::string::~string((string *)&local_6a0);
            location::~location(&local_490);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector(&local_7f0.others_);
            this = &local_680;
          }
          goto LAB_0032b914;
        }
        if (cVar2 != 't') {
          if (cVar2 == '{') {
            __return_storage_ptr__->is_ok_ = true;
            (__return_storage_ptr__->field_1).succ_.value = table;
          }
          else {
            guess_number_type<toml::type_config>(__return_storage_ptr__,loc,ctx);
          }
          goto LAB_0032b919;
        }
      }
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value = boolean;
      goto LAB_0032b919;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,
               "toml::parse_value: `true` must be in lowercase. A string must be surrounded by quotes."
               ,&local_7f1);
    syntax::boolean(&local_7f0,&ctx->toml_spec_);
    location::location(&local_328,&local_768);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"",&local_7f2);
    make_syntax_error<toml::detail::either>
              ((error_info *)&local_7d0,&local_540,&local_7f0,&local_328,&local_560);
    err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)&local_7d0);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_78);
    error_info::~error_info(&local_78);
    error_info::~error_info((error_info *)&local_7d0);
    std::__cxx11::string::~string((string *)&local_560);
    location::~location(&local_328);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_7f0.others_);
    this = &local_540;
  }
LAB_0032b914:
  std::__cxx11::string::~string((string *)this);
LAB_0032b919:
  location::~location(&local_768);
  return __return_storage_ptr__;
}

Assistant:

result<value_t, error_info>
guess_value_type(const location& loc, const context<TC>& ctx)
{
    const auto& sp = ctx.toml_spec();
    location inner(loc);

    switch(loc.current())
    {
        case '"' : {return ok(value_t::string);  }
        case '\'': {return ok(value_t::string);  }
        case '[' : {return ok(value_t::array);   }
        case '{' : {return ok(value_t::table);   }
        case 't' :
        {
            return ok(value_t::boolean);
        }
        case 'f' :
        {
            return ok(value_t::boolean);
        }
        case 'T' : // invalid boolean.
        {
            return err(make_syntax_error("toml::parse_value: "
                "`true` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'F' :
        {
            return err(make_syntax_error("toml::parse_value: "
                "`false` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::boolean(sp), inner));
        }
        case 'i' : // inf or string without quotes(syntax error).
        {
            if(literal("inf").scan(inner).is_ok())
            {
                return ok(value_t::floating);
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`inf` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        case 'I' : // Inf or string without quotes(syntax error).
        {
            return err(make_syntax_error("toml::parse_value: "
                "`inf` must be in lowercase. "
                "A string must be surrounded by quotes.",
                syntax::floating(sp), inner));
        }
        case 'n' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else if(literal("null").scan(inner).is_ok())
                {
                    return ok(value_t::empty);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "Both `nan` and `null` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
            else // must be nan.
            {
                if(literal("nan").scan(inner).is_ok())
                {
                    return ok(value_t::floating);
                }
                else
                {
                    return err(make_syntax_error("toml::parse_value: "
                        "`nan` must be in lowercase. "
                        "A string must be surrounded by quotes.",
                        syntax::floating(sp), inner));
                }
            }
        }
        case 'N' : // nan or null-extension
        {
            if(sp.ext_null_value)
            {
                return err(make_syntax_error("toml::parse_value: "
                    "Both `nan` and `null` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
            else
            {
                return err(make_syntax_error("toml::parse_value: "
                    "`nan` must be in lowercase. "
                    "A string must be surrounded by quotes.",
                    syntax::floating(sp), inner));
            }
        }
        default  :
        {
            return guess_number_type(loc, ctx);
        }
    }
}